

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec75.c
# Opt level: O1

int If_CutPerformCheck75__(If_Man_t *p,uint *pTruth,int nVars,int nLeaves,char *pStr)

{
  ulong uVar1;
  int v;
  int iVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  word *uTruth;
  long lVar6;
  long lVar7;
  int nVarsMin;
  word pCof1 [2];
  word pCof0 [2];
  char pDsdStr [1000];
  char *in_stack_fffffffffffffba8;
  int local_44c;
  word local_448 [5];
  word *local_420;
  char local_418 [1000];
  
  If_CutPerformCheck75__::Counter = If_CutPerformCheck75__::Counter + 1;
  if (nLeaves < 6) {
    return 1;
  }
  if (8 < nLeaves) {
    __assert_fail("nLeaves <= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDec75.c"
                  ,0xd4,"int If_CutPerformCheck75__(If_Man_t *, unsigned int *, int, int, char *)");
  }
  if ((nLeaves != 8) && (iVar2 = If_CutPerformCheck16(p,pTruth,nVars,nLeaves,"44"), iVar2 != 0)) {
    return 1;
  }
  iVar2 = Dau_DsdDecompose((word *)pTruth,nLeaves,0,0,local_418);
  if (nLeaves != 7) {
    if (nLeaves == 8) {
      if (4 < iVar2) {
        return 0;
      }
      uVar3 = Dau_DsdCheckDecAndExist(in_stack_fffffffffffffba8);
      return uVar3 >> 4 & 1;
    }
    if (iVar2 < 5) {
      uVar3 = Dau_DsdCheckDecExist(in_stack_fffffffffffffba8);
      if ((uVar3 & 0x18) != 0) {
        return 1;
      }
      uVar3 = Dau_DsdCheckDecAndExist(in_stack_fffffffffffffba8);
      if ((uVar3 & 0x1c) != 0) {
        return 1;
      }
    }
    iVar2 = If_CutPerformCheck07(p,pTruth,nVars,6,pStr);
    return iVar2;
  }
  if (iVar2 < 5) {
    uVar3 = Dau_DsdCheckDecExist(in_stack_fffffffffffffba8);
    if ((uVar3 & 0x10) != 0) {
      return 1;
    }
    uVar3 = Dau_DsdCheckDecAndExist(in_stack_fffffffffffffba8);
    if ((uVar3 & 0x18) != 0) {
      return 1;
    }
  }
  lVar7 = 0;
  local_420 = (word *)pTruth;
  do {
    local_448[0] = *(word *)pTruth;
    local_448[2] = local_448[0];
    local_448[1] = *(word *)((long)pTruth + 8);
    local_448[3] = local_448[1];
    if (lVar7 == 6) {
      local_448[3] = local_448[0];
    }
    else {
      uVar1 = s_Truths6Neg[lVar7];
      lVar4 = 0;
      do {
        local_448[lVar4 + 2] =
             (local_448[lVar4 + 2] & uVar1) << ((byte)(1 << ((byte)lVar7 & 0x1f)) & 0x3f) |
             local_448[lVar4 + 2] & uVar1;
        lVar4 = lVar4 + 1;
      } while (lVar4 == 1);
    }
    if (lVar7 == 6) {
      local_448[0] = local_448[1];
    }
    else {
      uVar1 = s_Truths6[lVar7];
      lVar4 = 0;
      do {
        local_448[lVar4] =
             (local_448[lVar4] & uVar1) >> ((byte)(1 << ((byte)lVar7 & 0x1f)) & 0x3f) |
             local_448[lVar4] & uVar1;
        lVar4 = lVar4 + 1;
      } while (lVar4 == 1);
    }
    lVar4 = 0;
    uVar3 = 0;
    do {
      uVar5 = (uint)(local_448[2] != local_448[3]);
      if (lVar4 != 6) {
        lVar6 = 0;
        do {
          if (((local_448[lVar6 + 2] >> ((byte)(1 << ((byte)lVar4 & 0x1f)) & 0x3f) ^
               local_448[lVar6 + 2]) & s_Truths6Neg[lVar4]) != 0) {
            uVar5 = 1;
            goto LAB_00421400;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 2);
        uVar5 = 0;
      }
LAB_00421400:
      uVar3 = uVar3 + uVar5;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 7);
    if (uVar3 < 4) {
      If_Dec7MinimumBase(local_448,(int *)0x0,7,&local_44c);
      uTruth = local_448;
LAB_004214cb:
      iVar2 = Dau_DsdDecompose(uTruth,local_44c,0,0,local_418);
      if ((iVar2 < 5) &&
         (uVar3 = Dau_DsdCheckDecExist(in_stack_fffffffffffffba8), (uVar3 & 0x18) != 0)) {
        return 1;
      }
    }
    else {
      lVar4 = 0;
      uVar3 = 0;
      do {
        uVar5 = (uint)(local_448[0] != local_448[1]);
        if (lVar4 != 6) {
          lVar6 = 0;
          do {
            if (((local_448[lVar6] >> ((byte)(1 << ((byte)lVar4 & 0x1f)) & 0x3f) ^ local_448[lVar6])
                & s_Truths6Neg[lVar4]) != 0) {
              uVar5 = 1;
              goto LAB_00421484;
            }
            lVar6 = lVar6 + 1;
          } while (lVar6 != 2);
          uVar5 = 0;
        }
LAB_00421484:
        uVar3 = uVar3 + uVar5;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 7);
      if (uVar3 < 4) {
        uTruth = local_448 + 2;
        If_Dec7MinimumBase(uTruth,(int *)0x0,7,&local_44c);
        pTruth = (uint *)local_420;
        goto LAB_004214cb;
      }
    }
    lVar7 = lVar7 + 1;
    if (lVar7 == 7) {
      return 0;
    }
  } while( true );
}

Assistant:

int If_CutPerformCheck75__( If_Man_t * p, unsigned * pTruth, int nVars, int nLeaves, char * pStr )
{
    char pDsdStr[1000];
    int nSizeNonDec, nDecExists, nDecAndExists;
    static int Counter = 0;
    Counter++;
    if ( nLeaves < 6 )
        return 1;
    assert( nLeaves <= 8 );
    if ( nLeaves < 8 && If_CutPerformCheck16( p, pTruth, nVars, nLeaves, "44" ) )
        return 1;
    // check decomposability
    nSizeNonDec = Dau_DsdDecompose( (word *)pTruth, nLeaves, 0, 0, pDsdStr );
//    printf( "Vars = %d  %s", nLeaves, pDsdStr );    printf( "\n" );
//    Extra_PrintBinary( stdout, &nDecExists, 8 );    printf( "\n" );
//    Extra_PrintBinary( stdout, &nDecAndExists, 8 ); printf( "\n" );
    if ( nLeaves == 8 )
    {
        if ( nSizeNonDec >= 5 )
            return 0;
        nDecAndExists = Dau_DsdCheckDecAndExist( pDsdStr );
        if ( nDecAndExists & 0x10 ) // bit 4
            return 1;
        else
            return 0;
    }
    if ( nLeaves == 7 )
    {
        extern void If_Dec7MinimumBase( word uTruth[2], int * pSupp, int nVarsAll, int * pnVars );
        word * pT = (word *)pTruth;
        word pCof0[2], pCof1[2];
        int v, nVarsMin;
        if ( nSizeNonDec < 5 )
        {
            nDecExists = Dau_DsdCheckDecExist( pDsdStr );
            if ( nDecExists & 0x10 ) // bit 4
                return 1;
            nDecAndExists = Dau_DsdCheckDecAndExist( pDsdStr );
            if ( nDecAndExists & 0x18 ) // bit 4, 3
                return 1;
        }
        // check cofactors
        for ( v = 0; v < 7; v++ )
        {
            pCof0[0] = pCof1[0] = pT[0];
            pCof0[1] = pCof1[1] = pT[1];
            Abc_TtCofactor0( pCof0, 2, v );
            Abc_TtCofactor1( pCof1, 2, v );
            if ( Abc_TtSupportSize(pCof0, 7) < 4 )
            {
                If_Dec7MinimumBase( pCof1, NULL, 7, &nVarsMin );
                nSizeNonDec = Dau_DsdDecompose( pCof1, nVarsMin, 0, 0, pDsdStr );
                if ( nSizeNonDec >= 5 )
                    continue;
                nDecExists = Dau_DsdCheckDecExist( pDsdStr );
                if ( nDecExists & 0x18 ) // bit 4, 3
                    return 1;
            }
            else if ( Abc_TtSupportSize(pCof1, 7) < 4 )
            {
                If_Dec7MinimumBase( pCof0, NULL, 7, &nVarsMin );
                nSizeNonDec = Dau_DsdDecompose( pCof0, nVarsMin, 0, 0, pDsdStr );
                if ( nSizeNonDec >= 5 )
                    continue;
                nDecExists = Dau_DsdCheckDecExist( pDsdStr );
                if ( nDecExists & 0x18 ) // bit 4, 3
                    return 1;
            }
        }
        return 0;
    }
    if ( nLeaves == 6 )
    {
        if ( nSizeNonDec < 5 )
        {
            nDecExists = Dau_DsdCheckDecExist( pDsdStr );
            if ( nDecExists & 0x18 ) // bit 4, 3
                return 1;
            nDecAndExists = Dau_DsdCheckDecAndExist( pDsdStr );
            if ( nDecAndExists & 0x1C ) // bit 4, 3, 2
                return 1;
        }
        return If_CutPerformCheck07( p, pTruth, nVars, nLeaves, pStr );
    }
    assert( 0 );
    return 0;
}